

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O2

void __thiscall
Encoder::ValidateCRCOnFinalBuffer
          (Encoder *this,BYTE *finalCodeBufferStart,size_t finalCodeSize,size_t jumpTableSize,
          BYTE *oldCodeBufferStart,uint initialCrcSeed,uint bufferCrcToValidate,
          BOOL isSuccessBrShortAndLoopAlign)

{
  RelocList *pRVar1;
  code *pcVar2;
  EncoderMD *this_00;
  BYTE *pBVar3;
  bool bVar4;
  uint uVar5;
  Type *reloc;
  BYTE *pBVar6;
  undefined4 *puVar7;
  int index;
  long lVar8;
  BYTE *pBVar9;
  int iVar10;
  uint local_8c;
  BYTE *local_88;
  BYTE *local_80;
  size_t local_78;
  long local_70;
  BYTE *local_68;
  EncoderMD *local_60;
  BYTE *local_58;
  undefined4 *local_50;
  List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  pRVar1 = (this->m_encoderMD).m_relocList;
  local_60 = &this->m_encoderMD;
  lVar8 = finalCodeSize - jumpTableSize;
  local_58 = finalCodeBufferStart;
  if (pRVar1 != (RelocList *)0x0) {
    local_88 = oldCodeBufferStart + lVar8;
    local_80 = finalCodeBufferStart + lVar8;
    pBVar9 = (BYTE *)0x0;
    local_78 = finalCodeSize;
    local_70 = lVar8;
    local_68 = oldCodeBufferStart;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_48 = pRVar1;
    local_38 = finalCodeBufferStart;
    for (index = 0; this_00 = local_60, finalCodeBufferStart = local_38, finalCodeSize = local_78,
        lVar8 = local_70,
        index < (local_48->
                super_ReadOnlyList<EncodeRelocAndLabels,_Memory::ArenaAllocator,_DefaultComparer>).
                count; index = index + 1) {
      reloc = JsUtil::
              List<EncodeRelocAndLabels,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(local_48,index);
      pBVar6 = EncoderMD::GetRelocBufferAddress(this_00,reloc);
      if ((local_68 <= pBVar6) &&
         (pBVar6 = EncoderMD::GetRelocBufferAddress(this_00,reloc), pBVar6 < local_88)) {
        pBVar6 = EncoderMD::GetRelocBufferAddress(this_00,reloc);
        pBVar6 = local_58 + ((long)pBVar6 - (long)local_68);
        if (pBVar6 < local_58 || local_80 <= pBVar6) {
          AssertCount = AssertCount + 1;
          local_40 = pBVar9;
          Js::Throw::LogAssert();
          puVar7 = local_50;
          *local_50 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                             ,0x42b,
                             "(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable))"
                             ,
                             "finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable)"
                            );
          if (!bVar4) goto LAB_003f1e52;
          *puVar7 = 0;
          pBVar9 = local_40;
        }
        uVar5 = EncoderMD::GetRelocDataSize(local_60,reloc);
        pBVar3 = local_38;
        local_40 = (BYTE *)CONCAT44(local_40._4_4_,uVar5);
        if (uVar5 != 0) {
          if (pBVar6 <= pBVar9 && pBVar9 != (BYTE *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = local_50;
            *local_50 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x42f,"(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr)",
                               "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress"
                              );
            if (!bVar4) goto LAB_003f1e52;
            *puVar7 = 0;
          }
          pBVar9 = pBVar3;
          if (pBVar6 < pBVar3) {
            AssertCount = AssertCount + 1;
            local_38 = pBVar3;
            Js::Throw::LogAssert();
            puVar7 = local_50;
            *local_50 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                               ,0x435,"(currentEndAddress >= currentStartAddress)",
                               "currentEndAddress >= currentStartAddress");
            if (!bVar4) goto LAB_003f1e52;
            *puVar7 = 0;
            pBVar9 = local_38;
          }
          initialCrcSeed = CalculateCRC(initialCrcSeed,(long)pBVar6 - (long)pBVar3,pBVar9);
          iVar10 = (int)local_40;
          while (bVar4 = iVar10 != 0, iVar10 = iVar10 + -1, bVar4) {
            initialCrcSeed = CalculateCRC(initialCrcSeed,0);
          }
          local_38 = pBVar6 + ((ulong)local_40 & 0xffffffff);
          pBVar9 = pBVar6;
        }
      }
    }
  }
  pBVar9 = local_58 + lVar8;
  if (pBVar9 < finalCodeBufferStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                       ,0x445,"(currentEndAddress >= currentStartAddress)",
                       "currentEndAddress >= currentStartAddress");
    if (!bVar4) goto LAB_003f1e52;
    *puVar7 = 0;
  }
  local_8c = CalculateCRC(initialCrcSeed,(long)pBVar9 - (long)finalCodeBufferStart,
                          finalCodeBufferStart);
  EncoderMD::ApplyRelocs
            (local_60,(size_t)local_58,finalCodeSize,&local_8c,isSuccessBrShortAndLoopAlign,true);
  if (local_8c == bufferCrcToValidate) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar7 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                     ,0x44e,"(false)","false");
  if (bVar4) {
    *puVar7 = 0;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_003f1e52:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void Encoder::ValidateCRCOnFinalBuffer(_In_reads_bytes_(finalCodeSize) BYTE * finalCodeBufferStart, size_t finalCodeSize, size_t jumpTableSize, _In_reads_bytes_(finalCodeSize) BYTE * oldCodeBufferStart, uint initialCrcSeed, uint bufferCrcToValidate, BOOL isSuccessBrShortAndLoopAlign)
{
    RelocList * relocList = m_encoderMD.GetRelocList();

    BYTE * currentStartAddress = finalCodeBufferStart;
    BYTE * currentEndAddress = nullptr;
    size_t crcSizeToCompute = 0;

    size_t finalCodeSizeWithoutJumpTable = finalCodeSize - jumpTableSize;

    uint finalBufferCRC = initialCrcSeed;

    BYTE * oldPtr = nullptr;

    if (relocList != nullptr)
    {
        for (int index = 0; index < relocList->Count(); index++)
        {
            EncodeRelocAndLabels * relocTuple = &relocList->Item(index);

            //We will deal with the jump table and dictionary entries along with other reloc records in ApplyRelocs()
            if ((BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) >= oldCodeBufferStart && (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) < (oldCodeBufferStart + finalCodeSizeWithoutJumpTable))
            {
                BYTE* finalBufferRelocTuplePtr = (BYTE*)m_encoderMD.GetRelocBufferAddress(relocTuple) - oldCodeBufferStart + finalCodeBufferStart;
                Assert(finalBufferRelocTuplePtr >= finalCodeBufferStart && finalBufferRelocTuplePtr < (finalCodeBufferStart + finalCodeSizeWithoutJumpTable));
                uint relocDataSize = m_encoderMD.GetRelocDataSize(relocTuple);
                if (relocDataSize != 0)
                {
                    AssertMsg(oldPtr == nullptr || oldPtr < finalBufferRelocTuplePtr, "Assumption here is that the reloc list is strictly increasing in terms of bufferAddress");
                    oldPtr = finalBufferRelocTuplePtr;

                    currentEndAddress = finalBufferRelocTuplePtr;
                    crcSizeToCompute = currentEndAddress - currentStartAddress;

                    Assert(currentEndAddress >= currentStartAddress);

                    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);
                    for (uint i = 0; i < relocDataSize; i++)
                    {
                        finalBufferCRC = CalculateCRC(finalBufferCRC, 0);
                    }
                    currentStartAddress = currentEndAddress + relocDataSize;
                }
            }
        }
    }

    currentEndAddress = finalCodeBufferStart + finalCodeSizeWithoutJumpTable;
    crcSizeToCompute = currentEndAddress - currentStartAddress;

    Assert(currentEndAddress >= currentStartAddress);

    finalBufferCRC = CalculateCRC(finalBufferCRC, crcSizeToCompute, currentStartAddress);

    //Include all offsets from the reloc records to the CRC.
    m_encoderMD.ApplyRelocs((size_t)finalCodeBufferStart, finalCodeSize, &finalBufferCRC, isSuccessBrShortAndLoopAlign, true);

    if (finalBufferCRC != bufferCrcToValidate)
    {
        Assert(false);
        Fatal();
    }
}